

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O1

void __thiscall
ot::commissioner::CommissionerSafe::CommandReenroll
          (CommissionerSafe *this,ErrorHandler *aHandler,string *aDstAddr)

{
  pointer pcVar1;
  _func_void *p_Var2;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  CommissionerSafe *local_70;
  _Any_data local_68;
  code *local_58;
  undefined8 uStack_50;
  undefined1 *local_48;
  long local_40;
  undefined1 local_38 [16];
  
  local_70 = this;
  std::function<void_(ot::commissioner::Error)>::function
            ((function<void_(ot::commissioner::Error)> *)&local_68,aHandler);
  pcVar1 = (aDstAddr->_M_dataplus)._M_p;
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + aDstAddr->_M_string_length);
  local_88 = (code *)0x0;
  pcStack_80 = (code *)0x0;
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  p_Var2 = (_func_void *)operator_new(0x48);
  *(CommissionerSafe **)p_Var2 = local_70;
  *(undefined8 *)(p_Var2 + 8) = 0;
  *(undefined8 *)(p_Var2 + 0x10) = 0;
  *(undefined8 *)(p_Var2 + 0x18) = 0;
  *(undefined8 *)(p_Var2 + 0x20) = uStack_50;
  if (local_58 != (code *)0x0) {
    *(void **)(p_Var2 + 8) = local_68._M_unused._M_object;
    *(undefined8 *)(p_Var2 + 0x10) = local_68._8_8_;
    *(code **)(p_Var2 + 0x18) = local_58;
    local_58 = (code *)0x0;
    uStack_50 = 0;
  }
  *(_func_void **)(p_Var2 + 0x28) = p_Var2 + 0x38;
  std::__cxx11::string::_M_construct<char*>((string *)(p_Var2 + 0x28),local_48,local_48 + local_40);
  pcStack_80 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_safe.cpp:399:22)>
               ::_M_invoke;
  local_88 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_safe.cpp:399:22)>
             ::_M_manager;
  local_98._M_unused._M_function_pointer = p_Var2;
  PushAsyncRequest(this,(AsyncRequest *)&local_98);
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  return;
}

Assistant:

void CommissionerSafe::CommandReenroll(ErrorHandler aHandler, const std::string &aDstAddr)
{
    PushAsyncRequest([=]() { mImpl->CommandReenroll(aHandler, aDstAddr); });
}